

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::compiler::Compiler::CompiledModule> * __thiscall
kj::Own<capnp::compiler::Compiler::CompiledModule>::operator=
          (Own<capnp::compiler::Compiler::CompiledModule> *this,
          Own<capnp::compiler::Compiler::CompiledModule> *other)

{
  Disposer *this_00;
  CompiledModule *object;
  CompiledModule *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::compiler::Compiler::CompiledModule> *other_local;
  Own<capnp::compiler::Compiler::CompiledModule> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (CompiledModule *)0x0;
  if (object != (CompiledModule *)0x0) {
    Disposer::dispose<capnp::compiler::Compiler::CompiledModule>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }